

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

FBaseCVar * FindCVarSub(char *var_name,int namelen)

{
  char *__s1;
  int iVar1;
  FBaseCVar *pFVar2;
  
  if ((var_name != (char *)0x0) && (CVars != (FBaseCVar *)0x0)) {
    pFVar2 = CVars;
    do {
      __s1 = pFVar2->Name;
      iVar1 = strncasecmp(__s1,var_name,(long)namelen);
      if ((iVar1 == 0) && (__s1[namelen] == '\0')) {
        return pFVar2;
      }
      pFVar2 = pFVar2->m_Next;
    } while (pFVar2 != (FBaseCVar *)0x0);
  }
  return (FBaseCVar *)0x0;
}

Assistant:

FBaseCVar *FindCVarSub (const char *var_name, int namelen)
{
	FBaseCVar *var;

	if (var_name == NULL)
		return NULL;

	var = CVars;
	while (var)
	{
		const char *probename = var->GetName ();

		if (strnicmp (probename, var_name, namelen) == 0 &&
			probename[namelen] == 0)
		{
			break;
		}
		var = var->m_Next;
	}
	return var;
}